

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::
OP_ProfiledLdSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout)

{
  Var value;
  
  value = OP_LdSlot(this,instance,
                    (playout->super_OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>)
                    .SlotIndex);
  ProfilingHelpers::ProfileLdSlot(value,*(FunctionBody **)(this + 0x88),playout->profileId);
  return value;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledLdSlot(Var instance, const unaligned T* playout)
    {
        Var value = OP_LdSlot(instance, playout->SlotIndex);
        ProfilingHelpers::ProfileLdSlot(value, GetFunctionBody(), playout->profileId);
        return value;
    }